

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag)

{
  char *pcVar1;
  bool bVar2;
  allocator local_39;
  string local_38;
  char *local_18;
  char *flag_local;
  cmMakefile *this_local;
  
  if (flag != (char *)0x0) {
    local_18 = flag;
    flag_local = (char *)this;
    AddDefineFlag(this,flag,&this->DefineFlagsOrig);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    bVar2 = ParseDefineFlag(this,&local_38,false);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (!bVar2) {
      AddDefineFlag(this,local_18,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag)
{
  if (!flag) {
    return;
  }

  // Update the string used for the old DEFINITIONS property.
  this->AddDefineFlag(flag, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if (this->ParseDefineFlag(flag, false)) {
    return;
  }

  // Add this flag that does not look like a definition.
  this->AddDefineFlag(flag, this->DefineFlags);
}